

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O0

ares_status_t
ares_dns_parse_rr(ares_buf_t *buf,uint flags,ares_dns_section_t sect,ares_dns_record_t *dnsrec)

{
  ares_bool_t aVar1;
  ares_dns_rr_t *paVar2;
  size_t sVar3;
  size_t sVar4;
  ares_dns_rr_t *paVar5;
  uint uVar6;
  uint local_9c;
  ares_dns_class_t local_94;
  ares_bool_t namecomp;
  size_t processed_len;
  size_t remaining_len;
  ares_dns_rr_t *rr;
  size_t rdlength;
  ares_dns_class_t local_38;
  uint ttl;
  ares_dns_class_t qclass;
  ares_dns_rec_type_t type;
  ares_status_t status;
  unsigned_short raw_type;
  unsigned_short u16;
  char *name;
  ares_dns_record_t *dnsrec_local;
  ares_dns_section_t sect_local;
  uint flags_local;
  ares_buf_t *buf_local;
  
  _status = (char *)0x0;
  remaining_len = 0;
  name = (char *)dnsrec;
  dnsrec_local._0_4_ = sect;
  dnsrec_local._4_4_ = flags;
  _sect_local = buf;
  qclass = ares_dns_name_parse(buf,(char **)&status,ARES_FALSE);
  if ((qclass == 0) &&
     (qclass = ares_buf_fetch_be16(_sect_local,(unsigned_short *)((long)&type + 2)), qclass == 0)) {
    ttl = (uint)(ushort)type._2_2_;
    type._0_2_ = type._2_2_;
    qclass = ares_buf_fetch_be16(_sect_local,(unsigned_short *)((long)&type + 2));
    if (qclass == 0) {
      local_38 = (ares_dns_class_t)(ushort)type._2_2_;
      qclass = ares_buf_fetch_be32(_sect_local,(uint *)((long)&rdlength + 4));
      if ((qclass == 0) &&
         (qclass = ares_buf_fetch_be16(_sect_local,(unsigned_short *)((long)&type + 2)), qclass == 0
         )) {
        rr = (ares_dns_rr_t *)(ulong)(ushort)type._2_2_;
        aVar1 = ares_dns_rec_type_isvalid(ttl,ARES_FALSE);
        if (aVar1 == ARES_FALSE) {
          ttl = 0x10000;
        }
        aVar1 = ares_dns_rec_allow_name_comp(ttl);
        paVar5 = rr;
        if ((ares_dns_section_t)dnsrec_local == ARES_SECTION_ANSWER) {
          uVar6 = 8;
          if (aVar1 != ARES_FALSE) {
            uVar6 = 1;
          }
          if ((dnsrec_local._4_4_ & uVar6) != 0) {
            ttl = 0x10000;
          }
        }
        if ((ares_dns_section_t)dnsrec_local == ARES_SECTION_AUTHORITY) {
          uVar6 = 0x10;
          if (aVar1 != ARES_FALSE) {
            uVar6 = 2;
          }
          if ((dnsrec_local._4_4_ & uVar6) != 0) {
            ttl = 0x10000;
          }
        }
        if ((ares_dns_section_t)dnsrec_local == ARES_SECTION_ADDITIONAL) {
          uVar6 = 0x20;
          if (aVar1 != ARES_FALSE) {
            uVar6 = 4;
          }
          if ((dnsrec_local._4_4_ & uVar6) != 0) {
            ttl = 0x10000;
          }
        }
        paVar2 = (ares_dns_rr_t *)ares_buf_len(_sect_local);
        if (paVar2 < paVar5) {
          qclass = 10;
        }
        else {
          if (ttl == 0x29) {
            local_94 = ARES_CLASS_IN;
            local_9c = 0;
          }
          else {
            local_9c = rdlength._4_4_;
            local_94 = local_38;
          }
          qclass = ares_dns_record_rr_add
                             ((ares_dns_rr_t **)&remaining_len,(ares_dns_record_t *)name,
                              (ares_dns_section_t)dnsrec_local,_status,ttl,local_94,local_9c);
          if (qclass == 0) {
            sVar3 = ares_buf_len(_sect_local);
            qclass = ares_dns_parse_rr_data
                               (_sect_local,(size_t)rr,(ares_dns_rr_t *)remaining_len,ttl,
                                (undefined2)type,(unsigned_short)local_38,rdlength._4_4_);
            if (qclass == 0) {
              sVar4 = ares_buf_len(_sect_local);
              paVar5 = (ares_dns_rr_t *)(sVar3 - sVar4);
              if (rr < paVar5) {
                qclass = 10;
              }
              else if (paVar5 < rr) {
                ares_buf_consume(_sect_local,(long)rr - (long)paVar5);
              }
            }
          }
        }
      }
    }
  }
  ares_free(_status);
  return qclass;
}

Assistant:

static ares_status_t ares_dns_parse_rr(ares_buf_t *buf, unsigned int flags,
                                       ares_dns_section_t sect,
                                       ares_dns_record_t *dnsrec)
{
  char               *name = NULL;
  unsigned short      u16;
  unsigned short      raw_type;
  ares_status_t       status;
  ares_dns_rec_type_t type;
  ares_dns_class_t    qclass;
  unsigned int        ttl;
  size_t              rdlength;
  ares_dns_rr_t      *rr            = NULL;
  size_t              remaining_len = 0;
  size_t              processed_len = 0;
  ares_bool_t         namecomp;

  /* All RRs have the same top level format shown below:
   *                                 1  1  1  1  1  1
   *   0  1  2  3  4  5  6  7  8  9  0  1  2  3  4  5
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                                               |
   * /                                               /
   * /                      NAME                     /
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TYPE                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                     CLASS                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TTL                      |
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                   RDLENGTH                    |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--|
   * /                     RDATA                     /
   * /                                               /
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   */

  /* Name */
  status = ares_dns_name_parse(buf, &name, ARES_FALSE);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Type */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  type     = u16;
  raw_type = u16; /* Only used for raw rr data */

  /* Class */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  qclass = u16;

  /* TTL */
  status = ares_buf_fetch_be32(buf, &ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Length */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  rdlength = u16;

  if (!ares_dns_rec_type_isvalid(type, ARES_FALSE)) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  namecomp = ares_dns_rec_allow_name_comp(type);
  if (sect == ARES_SECTION_ANSWER &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AN_BASE_RAW : ARES_DNS_PARSE_AN_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_AUTHORITY &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_NS_BASE_RAW : ARES_DNS_PARSE_NS_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_ADDITIONAL &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AR_BASE_RAW : ARES_DNS_PARSE_AR_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  /* Pull into another buffer for safety */
  if (rdlength > ares_buf_len(buf)) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* Add the base rr */
  status =
    ares_dns_record_rr_add(&rr, dnsrec, sect, name, type,
                           type == ARES_REC_TYPE_OPT ? ARES_CLASS_IN : qclass,
                           type == ARES_REC_TYPE_OPT ? 0 : ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Record the current remaining length in the buffer so we can tell how
   * much was processed */
  remaining_len = ares_buf_len(buf);

  /* Fill in the data for the rr */
  status = ares_dns_parse_rr_data(buf, rdlength, rr, type, raw_type,
                                  (unsigned short)qclass, ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Determine how many bytes were processed */
  processed_len = remaining_len - ares_buf_len(buf);

  /* If too many bytes were processed, error! */
  if (processed_len > rdlength) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* If too few bytes were processed, consume the unprocessed data for this
   * record as the parser may not have wanted/needed to use it */
  if (processed_len < rdlength) {
    ares_buf_consume(buf, rdlength - processed_len);
  }


done:
  ares_free(name);
  return status;
}